

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bf_crc.hpp
# Opt level: O3

void __thiscall bf_crc::update_test_vector_count(bf_crc *this)

{
  byte bVar1;
  ulong uVar2;
  
  uVar2 = 1;
  if (this->polynomial_ == 0) {
    if (this->polynomial_range_ == true) {
      uVar2 = (ulong)this->polynomial_end_ - (ulong)this->polynomial_start_;
    }
    else {
      bVar1 = (byte)this->crc_width_;
      uVar2 = (0xffffffffUL >> (bVar1 & 0x3f)) << (bVar1 & 0x3f) ^ 0xffffffff;
    }
  }
  this->test_vector_count_ = uVar2;
  if (this->probe_final_xor_ == true) {
    bVar1 = (byte)this->crc_width_;
    uVar2 = uVar2 * ((0xffffffffUL >> (bVar1 & 0x3f)) << (bVar1 & 0x3f) ^ 0xffffffff);
    this->test_vector_count_ = uVar2;
  }
  if (this->probe_initial_ == true) {
    bVar1 = (byte)this->crc_width_;
    uVar2 = uVar2 * ((0xffffffffUL >> (bVar1 & 0x3f)) << (bVar1 & 0x3f) ^ 0xffffffff);
    this->test_vector_count_ = uVar2;
  }
  if (this->probe_reflected_input_ == true) {
    uVar2 = uVar2 * 2;
    this->test_vector_count_ = uVar2;
  }
  if (this->probe_reflected_output_ == true) {
    this->test_vector_count_ = uVar2 * 2;
  }
  return;
}

Assistant:

void update_test_vector_count()
		{
			test_vector_count_ = 0;

			// TODO: Check polynomial range and throw exception if too large
			if (polynomial_ > 0) {
				test_vector_count_ = 1;
			} else if (polynomial_range_) {
				test_vector_count_ = (uint64_t)polynomial_end_ - (uint64_t)polynomial_start_;
			} else {
				test_vector_count_ = (uint64_t)max_value(crc_width_);
			}

			if (probe_final_xor_)
				test_vector_count_ *= (uint64_t)max_value(crc_width_);

			if (probe_initial_)
				test_vector_count_ *= (uint64_t)max_value(crc_width_);

			if (probe_reflected_input_)
				test_vector_count_ *= 2;

			if (probe_reflected_output_)
				test_vector_count_ *= 2;

		}